

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O2

void __thiscall
agge::tests::ParallelExecutionTests::MultithreadedParallelObjectMakesCallInDifferentThreads
          (ParallelExecutionTests *this)

{
  pointer ppVar1;
  ulong uVar2;
  uint local_170;
  allocator local_169;
  unsigned_long local_168;
  int local_15c;
  log_container log;
  string local_138;
  LocationInfo local_118;
  parallel p7;
  parallel p3;
  thread_capture tc;
  mutex mtx;
  
  parallel::parallel(&p3,3);
  parallel::parallel(&p7,7);
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mutex::mutex(&mtx);
  tc.super_kernel_function._vptr_kernel_function = (_func_int **)&PTR_operator___001d4c80;
  tc.log = &log;
  tc._mutex = &mtx;
  parallel::call(&p3,&tc.super_kernel_function);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_170 = 3;
  local_168 = (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::__cxx11::string::string
            ((string *)&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_15c);
  ut::LocationInfo::LocationInfo(&local_118,&local_138,0x67);
  ut::are_equal<unsigned_int,unsigned_long>(&local_170,&local_168,&local_118);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_168 = this_thread_id();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_170);
  ut::LocationInfo::LocationInfo(&local_118,&local_138,0x68);
  ut::are_equal<unsigned_long,unsigned_long>(&local_168,&ppVar1->second,&local_118);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_170 = 0;
  while( true ) {
    ppVar1 = log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)local_170;
    if ((ulong)((long)log.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)log.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar2) break;
    std::__cxx11::string::string
              ((string *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,(allocator *)&local_168);
    ut::LocationInfo::LocationInfo(&local_118,&local_138,0x6b);
    ut::are_equal<unsigned_int,unsigned_int>(&local_170,&ppVar1[uVar2].first,&local_118);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_15c = 1;
    local_168 = std::
                __count_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_pred<agge::tests::ParallelExecutionTests::second_equal>>
                          ((__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                            )log.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                            )log.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (_Iter_pred<agge::tests::ParallelExecutionTests::second_equal>)
                           log.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_170].second);
    std::__cxx11::string::string
              ((string *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_169);
    ut::LocationInfo::LocationInfo(&local_118,&local_138,0x6c);
    ut::are_equal<int,long>(&local_15c,(long *)&local_168,&local_118);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_170 = local_170 + 1;
  }
  if (log.
      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      log.
      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    log.
    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         log.
         super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  parallel::call(&p7,&tc.super_kernel_function);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_170 = 7;
  local_168 = (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::__cxx11::string::string
            ((string *)&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_15c);
  ut::LocationInfo::LocationInfo(&local_118,&local_138,0x78);
  ut::are_equal<unsigned_int,unsigned_long>(&local_170,&local_168,&local_118);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_168 = this_thread_id();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_170);
  ut::LocationInfo::LocationInfo(&local_118,&local_138,0x79);
  ut::are_equal<unsigned_long,unsigned_long>(&local_168,&ppVar1->second,&local_118);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_170 = 0;
  while( true ) {
    ppVar1 = log.
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)local_170;
    if ((ulong)((long)log.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)log.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar2) break;
    std::__cxx11::string::string
              ((string *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,(allocator *)&local_168);
    ut::LocationInfo::LocationInfo(&local_118,&local_138,0x7c);
    ut::are_equal<unsigned_int,unsigned_int>(&local_170,&ppVar1[uVar2].first,&local_118);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_15c = 1;
    local_168 = std::
                __count_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_pred<agge::tests::ParallelExecutionTests::second_equal>>
                          ((__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                            )log.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                            )log.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (_Iter_pred<agge::tests::ParallelExecutionTests::second_equal>)
                           log.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_170].second);
    std::__cxx11::string::string
              ((string *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,&local_169);
    ut::LocationInfo::LocationInfo(&local_118,&local_138,0x7d);
    ut::are_equal<int,long>(&local_15c,(long *)&local_168,&local_118);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_170 = local_170 + 1;
  }
  mutex::~mutex(&mtx);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::~_Vector_base(&log.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 );
  parallel::~parallel(&p7);
  parallel::~parallel(&p3);
  return;
}

Assistant:

test( MultithreadedParallelObjectMakesCallInDifferentThreads )
			{
				// INIT
				parallel p3(3), p7(7);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p3.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(3u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}

				// INIT
				log.clear();

				// ACT
				p7.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(7u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}
			}